

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

char * GrowSubId(char **p)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  
  cVar4 = DAT_0018d517;
  cVar1 = **p;
  do {
    pbVar3 = (byte *)*p;
    bVar2 = *pbVar3;
    iVar5 = isalnum((uint)bVar2);
    if ((iVar5 == 0) &&
       ((uVar7 = bVar2 - 0x21, 0x3e < uVar7 ||
        ((0x40000000c0002005U >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) break;
    *p = (char *)(pbVar3 + 1);
    pcVar6 = nidsubp + 1;
    *nidsubp = *pbVar3;
    nidsubp = pcVar6;
  } while ((cVar4 == '\0') || ((**p == '_') != (cVar1 != '_')));
  if (nidtemp + 0x7ff < nidsubp) {
    Error("ID too long, buffer overflow detected.",(char *)0x0,FATAL);
  }
  *nidsubp = '\0';
  pcVar6 = (char *)0x0;
  if (nidtemp[0] != '\0') {
    pcVar6 = nidtemp;
  }
  return pcVar6;
}

Assistant:

char* GrowSubId(char* & p) {	// appends next part of ID
	// The caller function ReplaceDefineInternal already assures the first char of ID is (isalpha() || '_')
	// so there are no extra tests here to verify validity of first character (like GetID(..) must do)
	const bool isSubwordSubstitution = Options::syx.IsSubwordSubstitution;	// help compiler -O2
	bool startsAtUnderscore = ('_' == *p);
	// add sub-parts delimiter in separate step (i.e. new ID grows like: "a", "a_", "a_b", ...)
	while (islabchar(*p)) {
		*nidsubp++ = *p++;
		// break at sub-word boundaries when new underscore block starts or ends
		if (isSubwordSubstitution && (('_' == *p) != startsAtUnderscore)) break;
	}
	if (nidtemp+LINEMAX <= nidsubp) Error("ID too long, buffer overflow detected.", NULL, FATAL);
	*nidsubp = 0;
	return nidtemp[0] ? nidtemp : nullptr;	// return non-empty string or nullptr
}